

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapArrayInfoCore<int>
               (SnapArrayInfo<int> *arrayInfo,FileWriter *writer)

{
  SnapArrayInfoBlock<int> *pSVar1;
  uint32 uVar2;
  uint uVar3;
  
  FileWriter::WriteLengthValue(writer,arrayInfo->Length,CommaSeparator);
  uVar2 = 0;
  for (pSVar1 = arrayInfo->Data; pSVar1 != (SnapArrayInfoBlock<int> *)0x0; pSVar1 = pSVar1->Next) {
    uVar2 = uVar2 + 1;
  }
  FileWriter::WriteLengthValue(writer,uVar2,CommaAndBigSpaceSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  (*writer->_vptr_FileWriter[8])(writer,1);
  for (pSVar1 = arrayInfo->Data; pSVar1 != (SnapArrayInfoBlock<int> *)0x0; pSVar1 = pSVar1->Next) {
    (*writer->_vptr_FileWriter[6])(writer,(ulong)(pSVar1 == arrayInfo->Data ^ 3));
    FileWriter::WriteUInt32(writer,index,pSVar1->FirstIndex,NoSeparator);
    FileWriter::WriteUInt32(writer,offset,pSVar1->LastIndex,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    for (uVar2 = pSVar1->FirstIndex; uVar2 < pSVar1->LastIndex; uVar2 = uVar2 + 1) {
      uVar3 = uVar2 - pSVar1->FirstIndex;
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(uVar3 != 0));
      FileWriter::WriteInt32(writer,isValid,(uint)pSVar1->ArrayValidTags[uVar3],NoSeparator);
      if (pSVar1->ArrayValidTags[uVar3] != '\0') {
        SnapArrayInfo_EmitValue(pSVar1->ArrayRangeContents[uVar3],writer);
      }
      (*writer->_vptr_FileWriter[7])(writer);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    (*writer->_vptr_FileWriter[7])(writer,0);
  }
  (*writer->_vptr_FileWriter[8])(writer,0xffffffff);
  (*writer->_vptr_FileWriter[5])(writer,2);
  return;
}

Assistant:

void EmitAddtlInfo_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, FileWriter* writer)
        {
            writer->WriteLengthValue(arrayInfo->Length, NSTokens::Separator::CommaSeparator);

            uint32 blockCount = 0;
            for(SnapArrayInfoBlock<T>* currInfo = arrayInfo->Data; currInfo != nullptr; currInfo = currInfo->Next)
            {
                blockCount++;
            }

            writer->WriteLengthValue(blockCount, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            writer->AdjustIndent(1);
            for(SnapArrayInfoBlock<T>* currInfo = arrayInfo->Data; currInfo != nullptr; currInfo = currInfo->Next)
            {
                writer->WriteRecordStart(currInfo == arrayInfo->Data ? NSTokens::Separator::BigSpaceSeparator : NSTokens::Separator::CommaAndBigSpaceSeparator);
                writer->WriteUInt32(NSTokens::Key::index, currInfo->FirstIndex);
                writer->WriteUInt32(NSTokens::Key::offset, currInfo->LastIndex, NSTokens::Separator::CommaSeparator);

                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = currInfo->FirstIndex; i < currInfo->LastIndex; ++i)
                {
                    uint32 j = (i - currInfo->FirstIndex);
                    writer->WriteRecordStart(j == 0 ? NSTokens::Separator::NoSeparator : NSTokens::Separator::CommaSeparator);

                    writer->WriteInt32(NSTokens::Key::isValid, currInfo->ArrayValidTags[j]);
                    if(currInfo->ArrayValidTags[j])
                    {
                        SnapArrayInfo_EmitValue(currInfo->ArrayRangeContents[j], writer);
                    }
                    writer->WriteRecordEnd();
                }
                writer->WriteSequenceEnd();
                writer->WriteRecordEnd();
            }
            writer->AdjustIndent(-1);
            writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
        }